

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSerialize.cpp
# Opt level: O3

void __thiscall TTD::TextFormatWriter::WriteSeparator(TextFormatWriter *this,Separator separator)

{
  undefined8 in_RAX;
  uint uVar1;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  if ((separator & CommaSeparator) != NoSeparator) {
    uStack_38._0_6_ = (undefined6)in_RAX;
    uStack_38 = CONCAT26(0x2c,(undefined6)uStack_38);
    FileWriter::WriteRawByteBuff_Fixed<char16_t>
              (&this->super_FileWriter,(char16_t *)((long)&uStack_38 + 6));
    if ((separator & BigSpaceSeparator) == NoSeparator) {
      uStack_38 = CONCAT26(0x20,(undefined6)uStack_38);
      FileWriter::WriteRawByteBuff_Fixed<char16_t>
                (&this->super_FileWriter,(char16_t *)((long)&uStack_38 + 6));
    }
    else {
      uStack_38 = CONCAT26(10,(undefined6)uStack_38);
      FileWriter::WriteRawByteBuff_Fixed<char16_t>
                (&this->super_FileWriter,(char16_t *)((long)&uStack_38 + 6));
      if (this->m_indentSize != 0) {
        uVar1 = 0;
        do {
          uStack_38 = CONCAT26(0x20,(undefined6)uStack_38);
          FileWriter::WriteRawByteBuff_Fixed<char16_t>
                    (&this->super_FileWriter,(char16_t *)((long)&uStack_38 + 6));
          uStack_38 = CONCAT26(0x20,(undefined6)uStack_38);
          FileWriter::WriteRawByteBuff_Fixed<char16_t>
                    (&this->super_FileWriter,(char16_t *)((long)&uStack_38 + 6));
          uVar1 = uVar1 + 1;
        } while (uVar1 < this->m_indentSize);
      }
    }
  }
  if (separator == BigSpaceSeparator) {
    uStack_38 = CONCAT26(10,(undefined6)uStack_38);
    FileWriter::WriteRawByteBuff_Fixed<char16_t>
              (&this->super_FileWriter,(char16_t *)((long)&uStack_38 + 6));
    if (this->m_indentSize != 0) {
      uVar1 = 0;
      do {
        uStack_38 = CONCAT26(0x20,(undefined6)uStack_38);
        FileWriter::WriteRawByteBuff_Fixed<char16_t>
                  (&this->super_FileWriter,(char16_t *)((long)&uStack_38 + 6));
        uStack_38 = CONCAT26(0x20,(undefined6)uStack_38);
        FileWriter::WriteRawByteBuff_Fixed<char16_t>
                  (&this->super_FileWriter,(char16_t *)((long)&uStack_38 + 6));
        uVar1 = uVar1 + 1;
      } while (uVar1 < this->m_indentSize);
    }
  }
  return;
}

Assistant:

void TextFormatWriter::WriteSeparator(NSTokens::Separator separator)
    {
        if((separator & NSTokens::Separator::CommaSeparator) == NSTokens::Separator::CommaSeparator)
        {
            this->WriteRawChar(_u(','));

            if((separator & NSTokens::Separator::BigSpaceSeparator) == NSTokens::Separator::BigSpaceSeparator)
            {
                this->WriteRawChar(_u('\n'));
                for(uint32 i = 0; i < this->m_indentSize; ++i)
                {
                    this->WriteRawChar(_u(' '));
                    this->WriteRawChar(_u(' '));
                }
            }
            else
            {
                this->WriteRawChar(_u(' '));
            }
        }

        if(separator == NSTokens::Separator::BigSpaceSeparator)
        {
            this->WriteRawChar(_u('\n'));
            for(uint32 i = 0; i < this->m_indentSize; ++i)
            {
                this->WriteRawChar(_u(' '));
                this->WriteRawChar(_u(' '));
            }
        }
    }